

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O1

void ucnv_toUnicode_UTF8(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  UConverterSharedData *pUVar5;
  uint uVar6;
  UChar *pUVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  UChar UVar11;
  uint32_t uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  
  pUVar2 = args->converter;
  pbVar8 = (byte *)args->source;
  pUVar7 = args->target;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  pUVar5 = pUVar2->sharedData;
  uVar14 = (uint)pUVar2->toULength;
  pbVar9 = pbVar8;
  if (pUVar4 <= pUVar7 || pUVar2->toULength < '\x01') goto LAB_002ba960;
  uVar12 = pUVar2->toUnicodeStatus;
  uVar10 = pUVar2->mode;
  pUVar2->toULength = '\0';
  pUVar2->toUnicodeStatus = 0;
  do {
    if ((int)uVar14 < (int)uVar10) {
      uVar15 = (ulong)uVar14;
      lVar16 = 0;
      do {
        pbVar9 = pbVar8 + lVar16;
        if (pbVar3 <= pbVar9) {
          pUVar2->toUnicodeStatus = uVar12;
          pUVar2->mode = uVar10;
          pUVar2->toULength = (char)uVar14 + (char)lVar16;
          goto LAB_002baab9;
        }
        bVar1 = *pbVar9;
        pUVar2->toUBytes[lVar16 + uVar15] = bVar1;
        if (((int)uVar10 < 3) || (1 < uVar15 + lVar16)) {
          bVar13 = (char)bVar1 < -0x40;
        }
        else if (uVar10 == 3) {
          bVar13 = '\x01' << (bVar1 >> 5) & " 000000000000\x1000"[uVar12 & 0xf];
        }
        else {
          bVar13 = (byte)(1 << ((byte)uVar12 & 7)) & ""[bVar1 >> 4];
        }
        if ((bVar13 == 0) &&
           ((((pUVar5 != &_CESU8Data_63 || (uVar15 + lVar16 != 1)) || (uVar12 != 0xed)) ||
            (-0x41 < (char)bVar1)))) {
          uVar6 = uVar14 + (int)lVar16;
          break;
        }
        uVar12 = uVar12 * 0x40 + (uint)bVar1;
        lVar16 = lVar16 + 1;
        uVar6 = uVar10;
      } while ((int)((int)lVar16 + uVar14) < (int)uVar10);
      uVar14 = uVar6;
      pbVar8 = pbVar8 + lVar16;
    }
    pbVar9 = pbVar8;
    if ((uVar14 != uVar10) || (pUVar5 == &_CESU8Data_63 && 3 < (int)uVar14)) {
      pUVar2->toULength = (int8_t)uVar14;
      *err = U_ILLEGAL_CHAR_FOUND;
LAB_002baab9:
      if ((pbVar9 < pbVar3) && ((pUVar4 <= pUVar7 && (*err < U_ILLEGAL_ARGUMENT_ERROR)))) {
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      args->target = pUVar7;
      args->source = (char *)pbVar9;
      return;
    }
    uVar14 = uVar12 - offsetsFromUTF8[(int)uVar10];
    if (uVar14 < 0x10000) {
      *pUVar7 = (UChar)uVar14;
      pUVar7 = pUVar7 + 1;
    }
    else {
      *pUVar7 = (short)(uVar14 >> 10) + L'ퟀ';
      UVar11 = (UChar)uVar14 & 0x3ffU | 0xdc00;
      if (pUVar4 <= pUVar7 + 1) {
        pUVar2->UCharErrorBuffer[0] = UVar11;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        pUVar7 = pUVar7 + 1;
        goto LAB_002baab9;
      }
      pUVar7[1] = UVar11;
      pUVar7 = pUVar7 + 2;
    }
LAB_002ba960:
    while( true ) {
      if ((pbVar3 <= pbVar9) || (pUVar4 <= pUVar7)) goto LAB_002baab9;
      bVar1 = *pbVar9;
      if ((char)bVar1 < '\0') break;
      *pUVar7 = (short)(char)bVar1;
      pUVar7 = pUVar7 + 1;
      pbVar9 = pbVar9 + 1;
    }
    uVar12 = (uint32_t)bVar1;
    pUVar2->toUBytes[0] = bVar1;
    pbVar8 = pbVar9 + 1;
    uVar10 = 0;
    uVar14 = 1;
    if ((byte)(bVar1 + 0x3e) < 0x33) {
      uVar10 = ((uint)(0xdf < bVar1) - (uint)(bVar1 < 0xf0)) + 3;
    }
  } while( true );
}

Assistant:

U_CDECL_BEGIN
static void  U_CALLCONV ucnv_toUnicode_UTF8 (UConverterToUnicodeArgs * args,
                                  UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = cnv->toUBytes;
    UBool isCESU8 = hasCESU8Data(cnv);
    uint32_t ch, ch2 = 0;
    int32_t i, inBytes;

    /* Restore size of current sequence */
    if (cnv->toULength > 0 && myTarget < targetLimit)
    {
        inBytes = cnv->mode;            /* restore # of bytes to consume */
        i = cnv->toULength;             /* restore # of bytes consumed */
        cnv->toULength = 0;

        ch = cnv->toUnicodeStatus;/*Stores the previously calculated ch from a previous call*/
        cnv->toUnicodeStatus = 0;
        goto morebytes;
    }


    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);
        if (U8_IS_SINGLE(ch))        /* Simple case */
        {
            *(myTarget++) = (UChar) ch;
        }
        else
        {
            /* store the first char */
            toUBytes[0] = (char)ch;
            inBytes = U8_COUNT_BYTES_NON_ASCII(ch); /* lookup current sequence length */
            i = 1;

morebytes:
            while (i < inBytes)
            {
                if (mySource < sourceLimit)
                {
                    toUBytes[i] = (char) (ch2 = *mySource);
                    if (!icu::UTF8::isValidTrail(ch, static_cast<uint8_t>(ch2), i, inBytes) &&
                            !(isCESU8 && i == 1 && ch == 0xed && U8_IS_TRAIL(ch2)))
                    {
                        break; /* i < inBytes */
                    }
                    ch = (ch << 6) + ch2;
                    ++mySource;
                    i++;
                }
                else
                {
                    /* stores a partially calculated target*/
                    cnv->toUnicodeStatus = ch;
                    cnv->mode = inBytes;
                    cnv->toULength = (int8_t) i;
                    goto donefornow;
                }
            }

            // In CESU-8, only surrogates, not supplementary code points, are encoded directly.
            if (i == inBytes && (!isCESU8 || i <= 3))
            {
                /* Remove the accumulated high bits */
                ch -= offsetsFromUTF8[inBytes];

                /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
                if (ch <= MAXIMUM_UCS2) 
                {
                    /* fits in 16 bits */
                    *(myTarget++) = (UChar) ch;
                }
                else
                {
                    /* write out the surrogates */
                    *(myTarget++) = U16_LEAD(ch);
                    ch = U16_TRAIL(ch);
                    if (myTarget < targetLimit)
                    {
                        *(myTarget++) = (UChar)ch;
                    }
                    else
                    {
                        /* Put in overflow buffer (not handled here) */
                        cnv->UCharErrorBuffer[0] = (UChar) ch;
                        cnv->UCharErrorBufferLength = 1;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                        break;
                    }
                }
            }
            else
            {
                cnv->toULength = (int8_t)i;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
}